

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

void __thiscall Client::handleLogoutRequest(Client *this,LogoutRequest *request)

{
  CommunicationStack *pCVar1;
  User *this_00;
  __type _Var2;
  string *__lhs;
  Event EVar3;
  LogoutResponse local_69;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_68;
  LogoutResponse local_51;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_50 [2];
  LogoutResponse local_29;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_28;
  LogoutRequest *local_18;
  LogoutRequest *request_local;
  Client *this_local;
  
  local_18 = request;
  request_local = (LogoutRequest *)this;
  if (this->user == (User *)0x0) {
    pCVar1 = this->communicationStack;
    LogoutResponse::LogoutResponse(&local_29,false);
    EVar3 = LogoutResponse::operator_cast_to_basic_json((LogoutResponse *)&local_28);
    (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,&local_28,EVar3.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_28);
  }
  else {
    __lhs = User::getUsername_abi_cxx11_(this->user);
    _Var2 = std::operator==(__lhs,&request->username);
    if (_Var2) {
      this_00 = this->user;
      if (this_00 != (User *)0x0) {
        User::~User(this_00);
        operator_delete(this_00);
      }
      this->user = (User *)0x0;
      pCVar1 = this->communicationStack;
      LogoutResponse::LogoutResponse(&local_51,true);
      EVar3 = LogoutResponse::operator_cast_to_basic_json((LogoutResponse *)local_50);
      (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,local_50,EVar3.m_value.object);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(local_50);
    }
    else {
      pCVar1 = this->communicationStack;
      LogoutResponse::LogoutResponse(&local_69,false);
      EVar3 = LogoutResponse::operator_cast_to_basic_json((LogoutResponse *)&local_68);
      (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,&local_68,EVar3.m_value.object);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_68);
    }
  }
  return;
}

Assistant:

void Client::handleLogoutRequest(LogoutRequest request)
{
	if(user == nullptr)
	{
		communicationStack->sendEvent(LogoutResponse(false));
		return;
	}

	if(user->getUsername() == request.username)
	{
		delete user;
		user = nullptr;
		communicationStack->sendEvent(LogoutResponse(true));
	}
	else
	{
		communicationStack->sendEvent(LogoutResponse(false));
	}
}